

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tes2CapabilityTests.cpp
# Opt level: O2

void __thiscall
deqp::gles2::ExtensionTests::init()::ExtGroup::ExtGroup(deqp::gles2::
TestCaseGroup__char_const__char_const__(void *this,TestCaseGroup *parent,char *name,char *desc)

{
  TestNode *node;
  
  *(undefined8 *)this = 0;
  *(ContextInfo **)((long)this + 8) = parent->m_context->m_contextInfo;
  node = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)node,(parent->super_TestCaseGroup).super_TestNode.m_testCtx,name,desc)
  ;
  *(TestNode **)this = node;
  tcu::TestNode::addChild((TestNode *)parent,node);
  return;
}

Assistant:

ExtGroup (TestCaseGroup* parent, const char* name, const char* desc)
				: group		(DE_NULL)
				, ctxInfo	(parent->getContext().getContextInfo())
			{
				group = new tcu::TestCaseGroup(parent->getTestContext(), name, desc);
				parent->addChild(group);
			}